

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O2

void __thiscall
Assimp::COBImporter::ReadPolH_Binary
          (COBImporter *this,Scene *out,StreamReaderLE *reader,ChunkInfo *nfo)

{
  iterator *this_00;
  Node *msh;
  _Map_pointer pppNVar1;
  _func_int **pp_Var2;
  Node *pNVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  short sVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  Mesh *this_01;
  _Elt_pointer psVar11;
  size_type sVar12;
  ChunkInfo *pCVar13;
  aiVector3D *v;
  _Map_pointer pppNVar14;
  _func_int **pp_Var15;
  COBImporter *this_02;
  _Elt_pointer ppNVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  float fVar20;
  chunk_guard cn;
  reverse_iterator<__gnu_cxx::__normal_iterator<Assimp::COB::VertexIndex_*,_std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>_>_>
  local_1f0;
  reverse_iterator<__gnu_cxx::__normal_iterator<Assimp::COB::VertexIndex_*,_std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>_>_>
  local_1e8;
  chunk_guard local_1e0;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [8];
  _Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_> a_Stack_1a0 [15]
  ;
  
  if (8 < nfo->version) {
    UnsupportedChunk_Binary(this,reader,nfo,"PolH");
    return;
  }
  local_1e0.cur = (long)(*(int *)&reader->current - *(int *)&reader->buffer);
  pCVar13 = nfo;
  local_1e0.nfo = nfo;
  local_1e0.reader = reader;
  this_01 = (Mesh *)operator_new(0x158);
  COB::Mesh::Mesh(this_01);
  std::__shared_ptr<Assimp::COB::Mesh,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::COB::Mesh,void>
            ((__shared_ptr<Assimp::COB::Mesh,(__gnu_cxx::_Lock_policy)2> *)local_1c8,this_01);
  this_02 = (COBImporter *)(local_1c8 + 8);
  local_1a8 = (undefined1  [8])local_1c8._0_8_;
  a_Stack_1a0[0]._M_impl.super__Vector_impl_data._M_start = (pointer)local_1c8._8_8_;
  local_1c8._0_8_ = (pointer)0x0;
  local_1c8._8_8_ = 0;
  std::deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
  ::emplace_back<std::shared_ptr<Assimp::COB::Node>>
            ((deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
              *)out,(shared_ptr<Assimp::COB::Node> *)local_1a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)a_Stack_1a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_02);
  psVar11 = (out->nodes).
            super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar11 ==
      (out->nodes).
      super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pCVar13 = (ChunkInfo *)
              (out->nodes).
              super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    psVar11 = (_Elt_pointer)(*(long *)&pCVar13[-1].version + 0x200);
  }
  msh = psVar11[-1].super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar10 = nfo->parent_id;
  uVar4 = nfo->version;
  uVar5 = nfo->size;
  (msh->super_ChunkInfo).id = nfo->id;
  (msh->super_ChunkInfo).parent_id = uVar10;
  (msh->super_ChunkInfo).version = uVar4;
  (msh->super_ChunkInfo).size = uVar5;
  ReadBasicNodeInfo_Binary(this_02,msh,reader,pCVar13);
  iVar8 = StreamReader<false,_false>::Get<int>(reader);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&msh[1].type,
             (long)iVar8);
  pppNVar1 = msh[1].temp_children.
             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
             ._M_impl.super__Deque_impl_data._M_map;
  for (pppNVar14 = *(_Map_pointer *)&msh[1].type; pppNVar14 != pppNVar1;
      pppNVar14 = (_Map_pointer)((long)pppNVar14 + 0xc)) {
    fVar20 = StreamReader<false,_false>::Get<float>(reader);
    *(float *)pppNVar14 = fVar20;
    fVar20 = StreamReader<false,_false>::Get<float>(reader);
    *(float *)((long)pppNVar14 + 4) = fVar20;
    fVar20 = StreamReader<false,_false>::Get<float>(reader);
    *(float *)(pppNVar14 + 1) = fVar20;
  }
  iVar8 = StreamReader<false,_false>::Get<int>(reader);
  std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize
            ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)(msh + 1),(long)iVar8
            );
  pp_Var2 = *(_func_int ***)&msh[1].super_ChunkInfo;
  for (pp_Var15 = msh[1]._vptr_Node; pp_Var15 != pp_Var2; pp_Var15 = pp_Var15 + 1) {
    fVar20 = StreamReader<false,_false>::Get<float>(reader);
    *(float *)pp_Var15 = fVar20;
    fVar20 = StreamReader<false,_false>::Get<float>(reader);
    *(float *)((long)pp_Var15 + 4) = fVar20;
  }
  iVar8 = StreamReader<false,_false>::Get<int>(reader);
  this_00 = &msh[1].temp_children.
             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
             ._M_impl.super__Deque_impl_data._M_start;
  std::vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>::reserve
            ((vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_> *)this_00,(long)iVar8);
  sVar12 = 0;
  do {
    if (sVar12 == (long)iVar8) {
      uVar10 = nfo->version;
      if (4 < uVar10) {
        iVar8 = StreamReader<false,_false>::Get<int>(reader);
        *(int *)&msh[1].temp_children.
                 super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node = iVar8;
        uVar10 = nfo->version;
      }
      if ((uVar10 & 0xfffffffe) == 6) {
        StreamReader<false,_false>::Get<int>(reader);
      }
      chunk_guard::~chunk_guard(&local_1e0);
      return;
    }
    bVar6 = StreamReader<false,_false>::Get<signed_char>(reader);
    if ((bVar6 & 8) == 0) {
      a_Stack_1a0[0]._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      a_Stack_1a0[0]._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1a8 = (undefined1  [8])0x0;
      a_Stack_1a0[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>::
      emplace_back<Assimp::COB::Face>
                ((vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_> *)this_00,
                 (Face *)local_1a8);
      std::_Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>::
      ~_Vector_base(a_Stack_1a0);
      ppNVar16 = msh[1].temp_children.
                 super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first;
    }
    else {
      ppNVar16 = msh[1].temp_children.
                 super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first;
      if (msh[1].temp_children.
          super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>.
          _M_impl.super__Deque_impl_data._M_start._M_cur == ppNVar16) {
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[56]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [56])"A hole is the first entity in the `PolH` chunk with id ");
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
                   &nfo->id);
        std::__cxx11::stringbuf::str();
        ThrowException((string *)local_1c8);
      }
    }
    sVar7 = StreamReader<false,_false>::Get<short>(reader);
    lVar17 = (long)sVar7;
    std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>::reserve
              ((vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_> *)
               (ppNVar16 + -3),((long)ppNVar16[-2] - (long)ppNVar16[-3] >> 3) + lVar17);
    lVar18 = lVar17;
    if ((bVar6 & 8) == 0) {
      sVar7 = StreamReader<false,_false>::Get<short>(reader);
      *(int *)(ppNVar16 + -4) = (int)sVar7;
      *(undefined4 *)((long)ppNVar16 + -0x1c) = 0;
    }
    while (bVar19 = lVar18 != 0, lVar18 = lVar18 + -1, bVar19) {
      local_1a8 = (undefined1  [8])0x0;
      std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>::
      emplace_back<Assimp::COB::VertexIndex>
                ((vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_> *)
                 (ppNVar16 + -3),(VertexIndex *)local_1a8);
      pNVar3 = ppNVar16[-2];
      fVar20 = (float)StreamReader<false,_false>::Get<int>(reader);
      pNVar3[-1].unit_scale = fVar20;
      iVar9 = StreamReader<false,_false>::Get<int>(reader);
      *(int *)&pNVar3[-1].field_0xd4 = iVar9;
    }
    if ((bVar6 & 8) != 0) {
      local_1e8.current._M_current =
           (__normal_iterator<Assimp::COB::VertexIndex_*,_std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>_>
            )ppNVar16[-2];
      local_1f0.current._M_current =
           (__normal_iterator<Assimp::COB::VertexIndex_*,_std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>_>
            )((long)local_1e8.current._M_current + -lVar17 * 8);
      std::
      reverse<std::reverse_iterator<__gnu_cxx::__normal_iterator<Assimp::COB::VertexIndex*,std::vector<Assimp::COB::VertexIndex,std::allocator<Assimp::COB::VertexIndex>>>>>
                (&local_1e8,&local_1f0);
    }
    sVar12 = sVar12 + 1;
  } while( true );
}

Assistant:

void COBImporter::ReadPolH_Binary(COB::Scene& out, StreamReaderLE& reader, const ChunkInfo& nfo)
{
    if(nfo.version > 8) {
        return UnsupportedChunk_Binary(reader,nfo,"PolH");
    }
    const chunk_guard cn(nfo,reader);

    out.nodes.push_back(std::shared_ptr<Mesh>(new Mesh()));
    Mesh& msh = (Mesh&)(*out.nodes.back().get());
    msh = nfo;

    ReadBasicNodeInfo_Binary(msh,reader,nfo);

    msh.vertex_positions.resize(reader.GetI4());
    for(aiVector3D& v : msh.vertex_positions) {
        v.x = reader.GetF4();
        v.y = reader.GetF4();
        v.z = reader.GetF4();
    }

    msh.texture_coords.resize(reader.GetI4());
    for(aiVector2D& v : msh.texture_coords) {
        v.x = reader.GetF4();
        v.y = reader.GetF4();
    }

    const size_t numf = reader.GetI4();
    msh.faces.reserve(numf);
    for(size_t i = 0; i < numf; ++i) {
        // XXX backface culling flag is 0x10 in flags

        // hole?
        bool hole;
        if ((hole = (reader.GetI1() & 0x08) != 0)) {
            // XXX Basically this should just work fine - then triangulator
            // should output properly triangulated data even for polygons
            // with holes. Test data specific to COB is needed to confirm it.
            if (msh.faces.empty()) {
                ThrowException(format("A hole is the first entity in the `PolH` chunk with id ") << nfo.id);
            }
        }
        else msh.faces.push_back(Face());
        Face& f = msh.faces.back();

        const size_t num = reader.GetI2();
        f.indices.reserve(f.indices.size() + num);

        if(!hole) {
            f.material = reader.GetI2();
            f.flags = 0;
        }

        for(size_t x = 0; x < num; ++x) {
            f.indices.push_back(VertexIndex());

            VertexIndex& v = f.indices.back();
            v.pos_idx = reader.GetI4();
            v.uv_idx = reader.GetI4();
        }

        if(hole) {
            std::reverse(f.indices.rbegin(),f.indices.rbegin()+num);
        }
    }
    if (nfo.version>4) {
        msh.draw_flags = reader.GetI4();
    }
    nfo.version>5 && nfo.version<8 ? reader.GetI4() : 0;
}